

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OrderMatcher.h
# Opt level: O0

void __thiscall OrderMatcher::display(OrderMatcher *this)

{
  bool bVar1;
  ostream *poVar2;
  pointer ppVar3;
  _Self local_28;
  _Base_ptr local_20;
  _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Market>_>
  local_18;
  const_iterator i;
  OrderMatcher *this_local;
  
  i._M_node = (_Base_ptr)this;
  poVar2 = std::operator<<((ostream *)&std::cout,"SYMBOLS:");
  std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
  poVar2 = std::operator<<((ostream *)&std::cout,"--------");
  std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
  std::
  _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Market>_>
  ::_Rb_tree_const_iterator(&local_18);
  local_20 = (_Base_ptr)
             std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Market,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Market>_>_>
             ::begin(&this->m_markets);
  local_18._M_node = local_20;
  while( true ) {
    local_28._M_node =
         (_Base_ptr)
         std::
         map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Market,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Market>_>_>
         ::end(&this->m_markets);
    bVar1 = std::operator!=(&local_18,&local_28);
    if (!bVar1) break;
    ppVar3 = std::
             _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Market>_>
             ::operator->(&local_18);
    poVar2 = std::operator<<((ostream *)&std::cout,(string *)ppVar3);
    std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
    std::
    _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Market>_>
    ::operator++(&local_18);
  }
  return;
}

Assistant:

void display() const {
    std::cout << "SYMBOLS:" << std::endl;
    std::cout << "--------" << std::endl;

    Markets::const_iterator i;
    for (i = m_markets.begin(); i != m_markets.end(); ++i) {
      std::cout << i->first << std::endl;
    }
  }